

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O3

void mycallback(double deltatime,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *param_3)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  int extraout_EDX;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long *aplStack_88 [2];
  long alStack_78 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_68;
  ostream *poStack_60;
  ulong uStack_58;
  code *pcStack_50;
  ulong local_40;
  double local_38;
  
  local_40 = *(long *)(message + 8) - *(long *)message;
  if ((int)local_40 != 0) {
    uVar5 = local_40 & 0xffffffff;
    uVar6 = 0;
    local_38 = deltatime;
    do {
      pcStack_50 = (code *)0x10238c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Byte ",5);
      pcStack_50 = (code *)0x102397;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      pcStack_50 = (code *)0x1023ae;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      if ((ulong)(*(long *)(message + 8) - *(long *)message) <= uVar6) {
        iVar4 = 0x10313e;
        pcStack_50 = main;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
        pcStack_50 = (code *)&std::cout;
        pvStack_68 = message;
        poStack_60 = poVar2;
        uStack_58 = uVar6;
        if (iVar4 < 3) {
          message = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x10);
          aplStack_88[0] = alStack_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)aplStack_88,"RtMidi Input Client","");
          RtMidiIn::RtMidiIn((RtMidiIn *)message,0,aplStack_88,100);
          if (aplStack_88[0] != alStack_78) {
            operator_delete(aplStack_88[0],alStack_78[0] + 1);
          }
          bVar1 = chooseMidiPort((RtMidiIn *)message);
          if (bVar1) {
            MidiInApi::setCallback
                      (*(_func_void_double_vector_ptr_void_ptr **)((RtMidiIn *)message + 8),
                       mycallback);
            (**(code **)(**(long **)((RtMidiIn *)message + 8) + 0x58))
                      (*(long **)((RtMidiIn *)message + 8),0,0,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n",
                       0x2f);
            std::istream::get((char *)&std::cin);
          }
        }
        else {
          usage();
          if (extraout_EDX != 1) {
            _Unwind_Resume(extraout_RAX);
          }
          plVar3 = (long *)__cxa_begin_catch();
          (**(code **)(*plVar3 + 0x18))(plVar3);
          __cxa_end_catch();
          if (message == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
            return;
          }
        }
        (**(code **)(*(long *)message + 0x40))(message);
        return;
      }
      pcStack_50 = (code *)0x1023ce;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*(byte *)(*(long *)message + uVar6))
      ;
      pcStack_50 = (code *)0x1023de;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    if ((int)local_40 != 0) {
      pcStack_50 = (code *)0x102408;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stamp = ",8);
      pcStack_50 = (code *)0x102416;
      poVar2 = std::ostream::_M_insert<double>(local_38);
      pcStack_50 = (code *)0x10242d;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      pcStack_50 = (code *)0x102438;
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return;
    }
  }
  return;
}

Assistant:

void mycallback( double deltatime, std::vector< unsigned char > *message, void */*userData*/ )
{
  unsigned int nBytes = message->size();
  for ( unsigned int i=0; i<nBytes; i++ )
    std::cout << "Byte " << i << " = " << (int)message->at(i) << ", ";
  if ( nBytes > 0 )
    std::cout << "stamp = " << deltatime << std::endl;
}